

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetFilenameComponentCommand.cxx
# Opt level: O2

bool __thiscall
cmGetFilenameComponentCommand::InitialPass
          (cmGetFilenameComponentCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  size_type sVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  string *psVar10;
  uint i;
  uint uVar11;
  string program;
  string result;
  string filename;
  string storeArgs;
  string programArgs;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)pbVar1 -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar7 < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"called with incorrect number of arguments",
               (allocator<char> *)&filename);
    cmCommand::SetError(&this->super_cmCommand,&result);
    std::__cxx11::string::~string((string *)&result);
    return false;
  }
  if ((((uVar7 != 0x60) && (bVar5 = std::operator==(pbVar1 + -1,"CACHE"), bVar5)) &&
      (pcVar8 = cmMakefile::GetDefinition
                          ((this->super_cmCommand).Makefile,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start), pcVar8 != (char *)0x0)) &&
     (bVar5 = cmSystemTools::IsNOTFOUND((char *)0x19327e), !bVar5)) {
    return true;
  }
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&filename,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 1));
  lVar9 = std::__cxx11::string::find((char *)&filename,0x422e66);
  uVar7 = 2;
  if (lVar9 != -1) {
    bVar5 = cmMakefile::PlatformIs64Bit((this->super_cmCommand).Makefile);
    cmSystemTools::ExpandRegistryValues(&filename,bVar5 + KeyWOW64_32);
    lVar9 = std::__cxx11::string::find((char *)&filename,0x4190c0);
    if (lVar9 != -1) {
      std::__cxx11::string::string
                ((string *)&storeArgs,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 1));
      cmSystemTools::ExpandRegistryValues(&storeArgs,KeyWOW64_64 - bVar5);
      lVar9 = std::__cxx11::string::find((char *)&storeArgs,0x4190c0);
      if (lVar9 == -1) {
        std::__cxx11::string::_M_assign((string *)&filename);
      }
      std::__cxx11::string::~string((string *)&storeArgs);
    }
  }
  storeArgs._M_dataplus._M_p = (pointer)&storeArgs.field_2;
  storeArgs._M_string_length = 0;
  programArgs._M_dataplus._M_p = (pointer)&programArgs.field_2;
  programArgs._M_string_length = 0;
  storeArgs.field_2._M_local_buf[0] = '\0';
  programArgs.field_2._M_local_buf[0] = '\0';
  bVar5 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 2,"DIRECTORY");
  if ((bVar5) ||
     (bVar5 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"PATH"), bVar5)) {
    cmsys::SystemTools::GetFilenamePath(&program,&filename);
LAB_001933b7:
    std::__cxx11::string::operator=((string *)&result,(string *)&program);
LAB_001933ca:
    std::__cxx11::string::~string((string *)&program);
  }
  else {
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 2,"NAME");
    if (bVar5) {
      cmsys::SystemTools::GetFilenameName(&program,&filename);
      goto LAB_001933b7;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 2,"PROGRAM");
    if (!bVar5) {
      bVar5 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"EXT");
      if (bVar5) {
        cmsys::SystemTools::GetFilenameExtension(&program,&filename);
      }
      else {
        bVar5 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2,"NAME_WE");
        if (bVar5) {
          cmsys::SystemTools::GetFilenameWithoutExtension(&program,&filename);
        }
        else {
          bVar5 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 2,"LAST_EXT");
          if (bVar5) {
            cmsys::SystemTools::GetFilenameLastExtension(&program,&filename);
          }
          else {
            bVar5 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 2,"NAME_WLE");
            if (!bVar5) {
              bVar5 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 2,"ABSOLUTE");
              if ((!bVar5) &&
                 (bVar5 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + 2,"REALPATH")
                 , !bVar5)) {
                std::operator+(&program,"unknown component ",
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 2);
                cmCommand::SetError(&this->super_cmCommand,&program);
                std::__cxx11::string::~string((string *)&program);
                bVar5 = false;
                goto LAB_001934cd;
              }
              psVar10 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                                  ((this->super_cmCommand).Makefile);
              std::__cxx11::string::string((string *)&program,(string *)psVar10);
              uVar7 = 3;
              while( true ) {
                uVar11 = (uint)uVar7;
                pbVar1 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)
                    <= uVar7) break;
                bVar5 = std::operator==(pbVar1 + uVar7,"BASE_DIR");
                if ((bVar5) &&
                   (uVar11 = uVar11 + 1,
                   (ulong)uVar11 <
                   (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 5))) {
                  std::__cxx11::string::_M_assign((string *)&program);
                }
                uVar7 = (ulong)(uVar11 + 1);
              }
              cmsys::SystemTools::CollapseFullPath(&local_68,&filename,&program);
              std::__cxx11::string::operator=((string *)&result,(string *)&local_68);
              std::__cxx11::string::~string((string *)&local_68);
              bVar5 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 2,"REALPATH");
              if (bVar5) {
                cmsys::SystemTools::GetRealPath(&local_68,&result,(string *)0x0);
                std::__cxx11::string::operator=((string *)&result,(string *)&local_68);
                std::__cxx11::string::~string((string *)&local_68);
              }
              goto LAB_001933ca;
            }
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&program,&filename);
          }
        }
      }
      goto LAB_001933b7;
    }
    while( true ) {
      uVar11 = (uint)uVar7;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar7)
      break;
      bVar5 = std::operator==(pbVar1 + uVar7,"PROGRAM_ARGS");
      if ((bVar5) &&
         (uVar11 = uVar11 + 1,
         (ulong)uVar11 <
         (ulong)((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5))) {
        std::__cxx11::string::_M_assign((string *)&storeArgs);
      }
      uVar7 = (ulong)(uVar11 + 1);
    }
    cmSystemTools::TrimWhitespace(&program,&filename);
    sVar3 = program._M_string_length;
    std::__cxx11::string::~string((string *)&program);
    if (sVar3 != 0) {
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      cmsys::SystemTools::FindProgram
                (&program,&filename,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_68,false);
      std::__cxx11::string::operator=((string *)&result,(string *)&program);
      std::__cxx11::string::~string((string *)&program);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68);
    }
    if (result._M_string_length == 0) {
      program._M_dataplus._M_p = (pointer)&program.field_2;
      program._M_string_length = 0;
      program.field_2._M_local_buf[0] = '\0';
      bVar5 = cmSystemTools::SplitProgramFromArgs(&filename,&program,&programArgs);
      if (bVar5) {
        bVar5 = cmsys::SystemTools::FileExists(&program);
        if (bVar5) {
          std::__cxx11::string::_M_assign((string *)&result);
        }
        else {
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmsys::SystemTools::FindProgram(&local_68,&program,&local_48,false);
          std::__cxx11::string::operator=((string *)&result,(string *)&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
        }
      }
      if (result._M_string_length == 0) {
        programArgs._M_string_length = 0;
        *programArgs._M_dataplus._M_p = '\0';
      }
      goto LAB_001933ca;
    }
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((ulong)((long)pbVar1 -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) < 0x61) ||
     (bVar5 = std::operator==(pbVar1 + -1,"CACHE"), _Var4 = programArgs._M_dataplus, !bVar5)) {
    if ((programArgs._M_string_length != 0) && (storeArgs._M_string_length != 0)) {
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,&storeArgs,programArgs._M_dataplus._M_p);
    }
    bVar5 = true;
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,result._M_dataplus._M_p);
  }
  else {
    if ((programArgs._M_string_length != 0) && (storeArgs._M_string_length != 0)) {
      pcVar2 = (this->super_cmCommand).Makefile;
      bVar5 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"PATH");
      cmMakefile::AddCacheDefinition(pcVar2,&storeArgs,_Var4._M_p,"",bVar5 ^ STRING,false);
    }
    _Var4._M_p = result._M_dataplus._M_p;
    pcVar2 = (this->super_cmCommand).Makefile;
    psVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    bVar6 = std::operator==(psVar10 + 2,"PATH");
    bVar5 = true;
    cmMakefile::AddCacheDefinition(pcVar2,psVar10,_Var4._M_p,"",bVar6 ^ STRING,false);
  }
LAB_001934cd:
  std::__cxx11::string::~string((string *)&programArgs);
  std::__cxx11::string::~string((string *)&storeArgs);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&result);
  return bVar5;
}

Assistant:

bool cmGetFilenameComponentCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // Check and see if the value has been stored in the cache
  // already, if so use that value
  if (args.size() >= 4 && args.back() == "CACHE") {
    const char* cacheValue = this->Makefile->GetDefinition(args.front());
    if (cacheValue && !cmSystemTools::IsNOTFOUND(cacheValue)) {
      return true;
    }
  }

  std::string result;
  std::string filename = args[1];
  if (filename.find("[HKEY") != std::string::npos) {
    // Check the registry as the target application would view it.
    cmSystemTools::KeyWOW64 view = cmSystemTools::KeyWOW64_32;
    cmSystemTools::KeyWOW64 other_view = cmSystemTools::KeyWOW64_64;
    if (this->Makefile->PlatformIs64Bit()) {
      view = cmSystemTools::KeyWOW64_64;
      other_view = cmSystemTools::KeyWOW64_32;
    }
    cmSystemTools::ExpandRegistryValues(filename, view);
    if (filename.find("/registry") != std::string::npos) {
      std::string other = args[1];
      cmSystemTools::ExpandRegistryValues(other, other_view);
      if (other.find("/registry") == std::string::npos) {
        filename = other;
      }
    }
  }
  std::string storeArgs;
  std::string programArgs;
  if (args[2] == "DIRECTORY" || args[2] == "PATH") {
    result = cmSystemTools::GetFilenamePath(filename);
  } else if (args[2] == "NAME") {
    result = cmSystemTools::GetFilenameName(filename);
  } else if (args[2] == "PROGRAM") {
    for (unsigned int i = 2; i < args.size(); ++i) {
      if (args[i] == "PROGRAM_ARGS") {
        i++;
        if (i < args.size()) {
          storeArgs = args[i];
        }
      }
    }

    // First assume the path to the program was specified with no
    // arguments and with no quoting or escaping for spaces.
    // Only bother doing this if there is non-whitespace.
    if (!cmSystemTools::TrimWhitespace(filename).empty()) {
      result = cmSystemTools::FindProgram(filename);
    }

    // If that failed then assume a command-line string was given
    // and split the program part from the rest of the arguments.
    if (result.empty()) {
      std::string program;
      if (cmSystemTools::SplitProgramFromArgs(filename, program,
                                              programArgs)) {
        if (cmSystemTools::FileExists(program)) {
          result = program;
        } else {
          result = cmSystemTools::FindProgram(program);
        }
      }
      if (result.empty()) {
        programArgs.clear();
      }
    }
  } else if (args[2] == "EXT") {
    result = cmSystemTools::GetFilenameExtension(filename);
  } else if (args[2] == "NAME_WE") {
    result = cmSystemTools::GetFilenameWithoutExtension(filename);
  } else if (args[2] == "LAST_EXT") {
    result = cmSystemTools::GetFilenameLastExtension(filename);
  } else if (args[2] == "NAME_WLE") {
    result = cmSystemTools::GetFilenameWithoutLastExtension(filename);
  } else if (args[2] == "ABSOLUTE" || args[2] == "REALPATH") {
    // If the path given is relative, evaluate it relative to the
    // current source directory unless the user passes a different
    // base directory.
    std::string baseDir = this->Makefile->GetCurrentSourceDirectory();
    for (unsigned int i = 3; i < args.size(); ++i) {
      if (args[i] == "BASE_DIR") {
        ++i;
        if (i < args.size()) {
          baseDir = args[i];
        }
      }
    }
    // Collapse the path to its simplest form.
    result = cmSystemTools::CollapseFullPath(filename, baseDir);
    if (args[2] == "REALPATH") {
      // Resolve symlinks if possible
      result = cmSystemTools::GetRealPath(result);
    }
  } else {
    std::string err = "unknown component " + args[2];
    this->SetError(err);
    return false;
  }

  if (args.size() >= 4 && args.back() == "CACHE") {
    if (!programArgs.empty() && !storeArgs.empty()) {
      this->Makefile->AddCacheDefinition(
        storeArgs, programArgs.c_str(), "",
        args[2] == "PATH" ? cmStateEnums::FILEPATH : cmStateEnums::STRING);
    }
    this->Makefile->AddCacheDefinition(
      args.front(), result.c_str(), "",
      args[2] == "PATH" ? cmStateEnums::FILEPATH : cmStateEnums::STRING);
  } else {
    if (!programArgs.empty() && !storeArgs.empty()) {
      this->Makefile->AddDefinition(storeArgs, programArgs.c_str());
    }
    this->Makefile->AddDefinition(args.front(), result.c_str());
  }

  return true;
}